

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)0>::decode5
          (Predecoder<(InstructionSet::M68k::Model)0> *this,uint16_t instruction)

{
  ushort uVar1;
  Preinstruction PVar2;
  byte local_1a;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)0> *this_local;
  
  switch(instruction & 0x1f8) {
  case 0:
  case 0x10:
  case 0x18:
  case 0x20:
  case 0x28:
  case 0x30:
  case 0x38:
    this_local._4_4_ = decode<(unsigned_char)142,true>(this,instruction);
    break;
  default:
    local_1a = (byte)instruction;
    if (local_1a - 0xf8 < 2) {
      this_local._4_4_ = decode<(unsigned_char)55,true>(this,instruction);
    }
    else {
      uVar1 = instruction & 0xf8;
      if (uVar1 != 0xc0) {
        if (uVar1 == 200) {
          PVar2 = decode<(unsigned_char)54,true>(this,instruction);
          return PVar2;
        }
        if ((((uVar1 != 0xd0) && (uVar1 != 0xd8)) && (uVar1 != 0xe0)) &&
           ((uVar1 != 0xe8 && (uVar1 != 0xf0)))) {
          memset((void *)((long)&this_local + 4),0,4);
          Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
          return this_local._4_4_;
        }
      }
      this_local._4_4_ = decode<(unsigned_char)55,true>(this,instruction);
    }
    break;
  case 0x40:
  case 0x50:
  case 0x58:
  case 0x60:
  case 0x68:
  case 0x70:
  case 0x78:
    this_local._4_4_ = decode<(unsigned_char)143,true>(this,instruction);
    break;
  case 0x48:
    this_local._4_4_ = decode<(unsigned_char)145,true>(this,instruction);
    break;
  case 0x80:
  case 0x90:
  case 0x98:
  case 0xa0:
  case 0xa8:
  case 0xb0:
  case 0xb8:
    this_local._4_4_ = decode<(unsigned_char)144,true>(this,instruction);
    break;
  case 0x88:
    this_local._4_4_ = decode<(unsigned_char)146,true>(this,instruction);
    break;
  case 0x100:
  case 0x110:
  case 0x118:
  case 0x120:
  case 0x128:
  case 0x130:
  case 0x138:
    this_local._4_4_ = decode<(unsigned_char)147,true>(this,instruction);
    break;
  case 0x140:
  case 0x150:
  case 0x158:
  case 0x160:
  case 0x168:
  case 0x170:
  case 0x178:
    this_local._4_4_ = decode<(unsigned_char)148,true>(this,instruction);
    break;
  case 0x148:
    this_local._4_4_ = decode<(unsigned_char)150,true>(this,instruction);
    break;
  case 0x180:
  case 400:
  case 0x198:
  case 0x1a0:
  case 0x1a8:
  case 0x1b0:
  case 0x1b8:
    this_local._4_4_ = decode<(unsigned_char)149,true>(this,instruction);
    break;
  case 0x188:
    this_local._4_4_ = decode<(unsigned_char)151,true>(this,instruction);
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode5(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f8) {
		// 4-11 (p115)
		case 0x000:
		case 0x010:	case 0x018:
		case 0x020:	case 0x028:
		case 0x030:	case 0x038:
			Decode(ADDQb);

		case 0x040:
		case 0x050:	case 0x058:
		case 0x060:	case 0x068:
		case 0x070:	case 0x078:
			Decode(ADDQw);

		case 0x080:
		case 0x090:	case 0x098:
		case 0x0a0:	case 0x0a8:
		case 0x0b0:	case 0x0b8:
			Decode(ADDQl);

		case 0x048:	Decode(ADDQAw);
		case 0x088:	Decode(ADDQAl);

		// 4-181 (p285)
		case 0x100:
		case 0x110:	case 0x118:
		case 0x120:	case 0x128:
		case 0x130:	case 0x138:
			Decode(SUBQb);

		case 0x140:
		case 0x150:	case 0x158:
		case 0x160:	case 0x168:
		case 0x170:	case 0x178:
			Decode(SUBQw);

		case 0x180:
		case 0x190:	case 0x198:
		case 0x1a0:	case 0x1a8:
		case 0x1b0:	case 0x1b8:
			Decode(SUBQl);

		case 0x148:	Decode(SUBQAw);
		case 0x188:	Decode(SUBQAl);

		default:	break;
	}

	switch(instruction & 0x0ff) {
		// 4-173 (p276)
		case 0x0f8:	case 0x0f9:	Decode(Op::Scc);

		// 4-189 (p294)
		case 0x0fa:	case 0x0fb:	case 0x0fc:
			DecodeReq(model >= Model::M68020, Op::TRAPcc);

		default:	break;
	}

	switch(instruction & 0x0f8) {
		// 4-173 (p276)
		case 0x0c0:
		case 0x0d0: case 0x0d8:
		case 0x0e0:	case 0x0e8:
		case 0x0f0:	Decode(Op::Scc);

		// 4-91 (p195)
		case 0x0c8:	Decode(Op::DBcc);

		default:	break;
	}
	return Preinstruction();
}